

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

art_node_t * art_node4_insert(art_node4_t *node,art_node_t *child,uint8_t key)

{
  art_node16_t *node_00;
  art_node_t *paVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)node->count;
  if (uVar5 < 4) {
    for (uVar3 = 0; (uVar4 = uVar5, uVar5 != uVar3 && (uVar4 = uVar3, node->keys[uVar3] <= key));
        uVar3 = uVar3 + 1) {
    }
    memmove(node->keys + uVar4 + 1,node->keys + uVar4,uVar5 - uVar4);
    memmove(node->children + uVar4 + 1,node->children + uVar4,(uVar5 - uVar4) * 8);
    node->children[uVar4] = child;
    node->keys[uVar4] = key;
    node->count = node->count + '\x01';
    return (art_node_t *)node;
  }
  node_00 = art_node16_create((node->base).prefix,(node->base).prefix_size);
  for (lVar2 = 2; lVar2 != 6; lVar2 = lVar2 + 1) {
    art_node16_insert(node_00,*(art_node_t **)((long)&node->base + lVar2 * 8),
                      (node->base).prefix[lVar2 + 4]);
  }
  roaring_free(node);
  paVar1 = art_node16_insert(node_00,child,key);
  return paVar1;
}

Assistant:

static art_node_t *art_node4_insert(art_node4_t *node, art_node_t *child,
                                    uint8_t key) {
    if (node->count < 4) {
        size_t idx = 0;
        for (; idx < node->count; ++idx) {
            if (node->keys[idx] > key) {
                break;
            }
        }
        size_t after = node->count - idx;
        // Shift other keys to maintain sorted order.
        memmove(node->keys + idx + 1, node->keys + idx,
                after * sizeof(art_key_chunk_t));
        memmove(node->children + idx + 1, node->children + idx,
                after * sizeof(art_node_t *));

        node->children[idx] = child;
        node->keys[idx] = key;
        node->count++;
        return (art_node_t *)node;
    }
    art_node16_t *new_node =
        art_node16_create(node->base.prefix, node->base.prefix_size);
    // Instead of calling insert, this could be specialized to 2x memcpy and
    // setting the count.
    for (size_t i = 0; i < 4; ++i) {
        art_node16_insert(new_node, node->children[i], node->keys[i]);
    }
    roaring_free(node);
    return art_node16_insert(new_node, child, key);
}